

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect.c
# Opt level: O2

void print_valtype(wasm_valtype_t *type)

{
  char cVar1;
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  char *__format;
  
  cVar1 = wasm_valtype_kind();
  switch(cVar1) {
  case '\0':
    __format = "i32";
    break;
  case '\x01':
    __format = "i64";
    break;
  case '\x02':
    __format = "f32";
    break;
  case '\x03':
    __format = "f64";
    break;
  default:
    if (cVar1 == -0x80) {
      __format = "anyref";
    }
    else {
      if (cVar1 != -0x7f) {
        return;
      }
      __format = "funcref";
    }
  }
  printf(__format,in_RSI,extraout_RDX,in_RAX);
  return;
}

Assistant:

void print_valtype(const wasm_valtype_t* type) {
  switch (wasm_valtype_kind(type)) {
    case WASM_I32: printf("i32"); break;
    case WASM_I64: printf("i64"); break;
    case WASM_F32: printf("f32"); break;
    case WASM_F64: printf("f64"); break;
    case WASM_ANYREF: printf("anyref"); break;
    case WASM_FUNCREF: printf("funcref"); break;
  }
}